

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  char *pcVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined7 extraout_var;
  mapped_type *ppcVar7;
  ostream *poVar8;
  pointer __k;
  PropertiesMap *this_00;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  unsigned_long systemLoad;
  SystemInformation info;
  TestList copy;
  string testWithMinProcessors;
  string fake_load_value;
  long *local_250;
  long local_248;
  long local_240 [2];
  ulong local_230;
  unsigned_long local_228;
  SystemInformation local_220;
  key_type local_214;
  ulong local_210;
  ulong local_208;
  vector<int,_std::allocator<int>_> local_200;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  ulong local_1c8;
  ulong local_1c0;
  cmCTestMultiProcessHandler *local_1b8;
  PropertiesMap *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar10 = this->ParallelLevel;
  bVar11 = this->RunningCount <= uVar10;
  uVar6 = uVar10 - this->RunningCount;
  local_230 = 0;
  if (bVar11) {
    local_230 = uVar6;
  }
  if ((bVar11 && uVar6 != 0) && (this->SerialTestRunning == false)) {
    local_1e8 = &local_1d8;
    local_1e0 = 0;
    local_1d8 = '\0';
    cmsys::SystemInformation::SystemInformation(&local_220);
    local_228 = 0;
    if (this->TestLoad == 0) {
      uVar6 = 0;
      uVar9 = 0;
      local_208 = 0;
    }
    else {
      pcVar1 = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = pcVar1;
      bVar11 = cmsys::SystemTools::GetEnv
                         ("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",(string *)local_1a8);
      uVar9 = CONCAT71(extraout_var,bVar11) & 0xffffffff;
      if (bVar11) {
        bVar11 = cmSystemTools::StringToULong((char *)local_1a8._0_8_,&local_228);
        if (!bVar11) {
          cmSystemTools::Error
                    ("Failed to parse fake load value: ",(char *)local_1a8._0_8_,(char *)0x0,
                     (char *)0x0);
        }
      }
      else {
        dVar12 = cmsys::SystemInformation::GetLoadAverage(&local_220);
        dVar12 = ceil(dVar12);
        local_228 = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
      }
      local_208 = 0;
      if (local_228 <= this->TestLoad) {
        local_208 = this->TestLoad - local_228;
      }
      if (local_208 <= local_230) {
        local_230 = local_208;
      }
      if ((char *)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      uVar6 = CONCAT71((int7)((ulong)pcVar1 >> 8),1);
    }
    local_1c8 = uVar9;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_200,&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
    if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      bVar11 = true;
    }
    else {
      this_00 = &this->Properties;
      __k = local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
      local_210 = uVar6;
      local_1b8 = this;
      local_1b0 = this_00;
      do {
        iVar4 = 2;
        if (this->SerialTestRunning != false) break;
        ppcVar7 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&this_00->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,__k);
        if (((*ppcVar7)->RunSerial != true) || (this->RunningCount == 0)) {
          local_1a8._0_4_ = *__k;
          ppcVar7 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&this_00->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type *)local_1a8);
          uVar6 = (long)(*ppcVar7)->Processors;
          if (this->ParallelLevel < (ulong)(long)(*ppcVar7)->Processors) {
            uVar6 = this->ParallelLevel;
          }
          if (this->TestLoad == 0) {
            bVar11 = false;
          }
          else {
            bVar11 = true;
            if (uVar6 <= local_208) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"OK to run ",10);
              local_214 = *__k;
              ppcVar7 = std::
                        map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                        ::operator[](&this_00->
                                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                     ,&local_214);
              local_250 = local_240;
              pcVar2 = ((*ppcVar7)->Name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_250,pcVar2,pcVar2 + ((*ppcVar7)->Name)._M_string_length);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_250,local_248);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", it requires ",0xe);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," procs & system load is: ",0x19);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              local_1c0 = uVar6;
              if (local_250 != local_240) {
                operator_delete(local_250,local_240[0] + 1);
              }
              pcVar3 = this->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar3,0,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x138,(char *)local_250,false);
              if (local_250 != local_240) {
                operator_delete(local_250,local_240[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              local_210 = 0;
              bVar11 = false;
              uVar6 = local_1c0;
            }
          }
          if (uVar6 <= uVar10) {
            local_250 = (long *)CONCAT44(local_250._4_4_,*__k);
            ppcVar7 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&this_00->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)&local_250);
            pcVar2 = ((*ppcVar7)->Name)._M_dataplus._M_p;
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,pcVar2,pcVar2 + ((*ppcVar7)->Name)._M_string_length);
            std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
            this = local_1b8;
            uVar10 = uVar6;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
              this = local_1b8;
            }
          }
          uVar9 = local_230 - uVar6;
          if ((bVar11 || local_230 < uVar6) || (bVar11 = StartTest(this,*__k), !bVar11)) {
            bVar11 = false;
            if (local_230 == 0) {
              iVar4 = 2;
              local_230 = 0;
            }
            else {
              bVar11 = true;
              iVar4 = 0;
            }
          }
          else {
            iVar4 = 0;
            if (this->StopTimePassed == false) {
              bVar11 = true;
              local_230 = uVar9;
            }
            else {
              iVar4 = 1;
              bVar11 = false;
            }
          }
          this_00 = local_1b0;
          if (!bVar11) break;
        }
        __k = __k + 1;
        iVar4 = 2;
      } while (__k != local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      bVar11 = iVar4 == 2;
      uVar6 = local_210;
    }
    if ((bVar11) && ((uVar6 & 1) != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"***** WAITING, ",0xf)
      ;
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x150,(char *)local_250,false);
      if (local_250 != local_240) {
        operator_delete(local_250,local_240[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if (this->SerialTestRunning == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Waiting for RUN_SERIAL test to finish.",0x26);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x153,(char *)local_250,false);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"System Load: ",0xd)
        ;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", Max Allowed Load: ",0x14);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", Smallest test ",0x10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1e8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," requires ",10);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x15a,(char *)local_250,false);
      }
      if (local_250 != local_240) {
        operator_delete(local_250,local_240[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"*****",5);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x15d,(char *)local_250,false);
      if (local_250 != local_240) {
        operator_delete(local_250,local_240[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((char)local_1c8 == '\0') {
        uVar5 = cmSystemTools::RandomSeed();
        cmCTestScriptHandler::SleepInSeconds(uVar5 % 5 + 1);
      }
      else {
        this->StopTimePassed = true;
      }
    }
    if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (key_type *)0x0) {
      operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cmsys::SystemInformation::~SystemInformation(&local_220);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  size_t numToStart = 0;
  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  bool usedFakeLoadForTesting = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    std::string fake_load_value;
    if (cmSystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",
                              fake_load_value)) {
      usedFakeLoadForTesting = true;
      if (!cmSystemTools::StringToULong(fake_load_value.c_str(),
                                        &systemLoad)) {
        cmSystemTools::Error("Failed to parse fake load value: ",
                             fake_load_value.c_str());
      }
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (TestList::iterator test = copy.begin(); test != copy.end(); ++test) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also running.
    if (this->Properties[*test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = GetProcessorsUsed(*test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG, "OK to run "
                     << GetName(*test) << ", it requires " << processors
                     << " procs & system load is: " << systemLoad
                     << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = GetName(*test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(*test)) {
      if (this->StopTimePassed) {
        return;
      }

      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***** WAITING, ");
    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "*****" << std::endl);

    if (usedFakeLoadForTesting) {
      // Break out of the infinite loop of waiting for our fake load
      // to come down.
      this->StopTimePassed = true;
    } else {
      // Wait between 1 and 5 seconds before trying again.
      cmCTestScriptHandler::SleepInSeconds(cmSystemTools::RandomSeed() % 5 +
                                           1);
    }
  }
}